

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_enum.cc
# Opt level: O1

char * i2s_ASN1_ENUMERATED_TABLE(X509V3_EXT_METHOD *meth,ASN1_ENUMERATED *aint)

{
  long *plVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  long *plVar5;
  bool bVar6;
  
  pcVar3 = (char *)ASN1_ENUMERATED_get(aint);
  piVar2 = (int *)meth->usr_data;
  pcVar4 = *(char **)(piVar2 + 2);
  bVar6 = pcVar4 == (char *)0x0;
  if (!bVar6) {
    if (pcVar3 != (char *)(long)*piVar2) {
      plVar5 = (long *)(piVar2 + 8);
      do {
        pcVar4 = (char *)*plVar5;
        bVar6 = pcVar4 == (char *)0x0;
        if (bVar6) goto LAB_0022ce03;
        plVar1 = plVar5 + -1;
        plVar5 = plVar5 + 3;
      } while (pcVar3 != (char *)(long)(int)*plVar1);
    }
    pcVar3 = OPENSSL_strdup(pcVar4);
  }
LAB_0022ce03:
  if (bVar6) {
    pcVar4 = i2s_ASN1_ENUMERATED(meth,aint);
    return pcVar4;
  }
  return pcVar3;
}

Assistant:

static char *i2s_ASN1_ENUMERATED_TABLE(const X509V3_EXT_METHOD *method,
                                       void *ext) {
  const ASN1_ENUMERATED *e = reinterpret_cast<const ASN1_ENUMERATED *>(ext);
  long strval = ASN1_ENUMERATED_get(e);
  for (const ENUMERATED_NAMES *enam =
           reinterpret_cast<const ENUMERATED_NAMES *>(method->usr_data);
       enam->lname; enam++) {
    if (strval == enam->bitnum) {
      return OPENSSL_strdup(enam->lname);
    }
  }
  return i2s_ASN1_ENUMERATED(method, e);
}